

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O2

bool ktx::operator==(vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                     *var)

{
  bool bVar1;
  _Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
  _Stack_28;
  
  SelectorRange::SelectorRange((SelectorRange *)&_Stack_28);
  bVar1 = std::operator==(var,(vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                               *)&_Stack_28);
  std::_Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
  ~_Vector_base(&_Stack_28);
  return bVar1;
}

Assistant:

bool operator==(const SelectorRange& var, All_t) {
        return var == SelectorRange{all};
    }